

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticTrig>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZQuadraticTrig> *this,void **vtt,TPZGeoMesh *DestMesh,
          TPZGeoElRefLess<pzgeom::TPZQuadraticTrig> *cp)

{
  long in_RCX;
  TPZQuadraticTrig *in_RSI;
  TPZQuadraticTrig *in_RDI;
  int n;
  int i;
  TPZGeoEl *in_stack_ffffffffffffff98;
  TPZGeoMesh *in_stack_ffffffffffffffa0;
  TPZGeoElSideIndex *this_00;
  void **in_stack_ffffffffffffffa8;
  TPZGeoElSideIndex *pTVar1;
  TPZGeoMesh *in_stack_ffffffffffffffb0;
  int local_30;
  
  TPZGeoEl::TPZGeoEl((TPZGeoEl *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                     in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  (in_RDI->super_TPZNodeRep<6,_pztopology::TPZTriangle>).super_TPZTriangle.super_TPZSavable.
  _vptr_TPZSavable =
       (in_RSI->super_TPZNodeRep<6,_pztopology::TPZTriangle>).super_TPZTriangle.super_TPZSavable.
       _vptr_TPZSavable;
  *(int64_t *)
   ((long)(in_RDI->super_TPZNodeRep<6,_pztopology::TPZTriangle>).fNodeIndexes +
   (long)((in_RDI->super_TPZNodeRep<6,_pztopology::TPZTriangle>).super_TPZTriangle.super_TPZSavable.
          _vptr_TPZSavable[-0xc] + -8)) =
       (in_RSI->super_TPZNodeRep<6,_pztopology::TPZTriangle>).fNodeIndexes[2];
  pzgeom::TPZQuadraticTrig::TPZQuadraticTrig(in_RDI,in_RSI,in_stack_ffffffffffffffb0);
  this_00 = (TPZGeoElSideIndex *)in_RDI[2].super_TPZNodeRep<6,_pztopology::TPZTriangle>.fNodeIndexes
  ;
  pTVar1 = (TPZGeoElSideIndex *)in_RDI[5].super_TPZNodeRep<6,_pztopology::TPZTriangle>.fNodeIndexes;
  do {
    TPZGeoElSideIndex::TPZGeoElSideIndex(this_00);
    this_00 = this_00 + 1;
  } while (this_00 != pTVar1);
  for (local_30 = 0; local_30 < 7; local_30 = local_30 + 1) {
    TPZGeoElSideIndex::operator=
              ((TPZGeoElSideIndex *)
               (in_RDI[2].super_TPZNodeRep<6,_pztopology::TPZTriangle>.fNodeIndexes +
               (long)local_30 * 3),(TPZGeoElSideIndex *)(in_RCX + 0x78 + (long)local_30 * 0x18));
  }
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TPZGeoMesh &DestMesh, const TPZGeoElRefLess &cp):
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),TPZGeoEl(DestMesh, cp), fGeo(cp.fGeo,DestMesh) {
	int i;
	const int n = TGeo::NSides;
	for(i = 0; i < n; i++){
		this->fNeighbours[i] = cp.fNeighbours[i];
	}
}